

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements
          (cmNinjaNormalTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *architectures,string *output)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  undefined8 this_00;
  bool bVar1;
  int iVar2;
  cmGlobalNinjaGenerator *this_01;
  string *psVar3;
  reference pbVar4;
  cmGeneratedFileStream *pcVar5;
  cmOutputConverter *pcVar6;
  mapped_type *pmVar7;
  cmGeneratorTarget *target;
  cmOutputConverter *local_d98;
  string *local_d38;
  string *local_d20;
  string *local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c58;
  allocator<char> local_c21;
  key_type local_c20;
  undefined1 local_c00 [8];
  string linkLibs;
  string linkPath;
  string frameworkPath;
  cmStateDirectory local_b88;
  undefined1 local_b60 [8];
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  key_type local_b10;
  cmAlphaNum local_af0;
  cmAlphaNum local_ac0;
  string local_a90;
  string_view local_a70;
  string local_a60;
  allocator<char> local_a39;
  key_type local_a38;
  cmAlphaNum local_a18;
  cmAlphaNum local_9e8;
  string local_9b8;
  string_view local_998;
  string local_988;
  cmAlphaNum local_968;
  cmAlphaNum local_938;
  string *local_908;
  string local_900;
  iterator local_8e0;
  size_type local_8d8;
  undefined1 local_8d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  iterator local_8a8;
  undefined8 local_8a0;
  string local_898;
  undefined1 local_878 [8];
  cmNinjaBuild dcompile;
  cmLocalNinjaGenerator *localGen;
  cmAlphaNum local_720;
  string *local_6f0;
  string local_6e8;
  iterator local_6c8;
  size_type local_6c0;
  allocator<char> local_6b1;
  key_type local_6b0;
  cmAlphaNum local_690;
  cmAlphaNum local_660;
  string local_630;
  allocator<char> local_609;
  key_type local_608;
  cmAlphaNum local_5e8;
  cmAlphaNum local_5b8;
  string local_588;
  allocator<char> local_561;
  key_type local_560;
  cmAlphaNum local_540;
  cmAlphaNum local_510;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  iterator local_498;
  size_type local_490;
  string local_488;
  undefined1 local_468 [8];
  cmNinjaBuild dlink;
  cmAlphaNum local_318;
  undefined1 local_2e8 [8];
  string cubin;
  string architecture;
  string *architectureKind;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_268 [8];
  cmNinjaBuild fatbinary;
  string ninjaOutputDir;
  cmAlphaNum local_108;
  string local_d8;
  cmAlphaNum local_b8;
  undefined1 local_88 [8];
  string objectDir;
  cmGlobalNinjaGenerator *globalGen;
  string *local_48;
  undefined1 local_40 [8];
  cmNinjaDeps explicitDeps;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *architectures_local;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  globalGen = (cmGlobalNinjaGenerator *)this;
  local_48 = config;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = output;
  WriteDeviceLinkStatements(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&)
  ::$_0::operator()[abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,&globalGen);
  this_01 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&local_d8,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  cmAlphaNum::cmAlphaNum(&local_b8,&local_d8);
  (*(this_01->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            ((undefined1 *)((long)&ninjaOutputDir.field_2 + 8),this_01,config);
  cmAlphaNum::cmAlphaNum(&local_108,(string *)((long)&ninjaOutputDir.field_2 + 8));
  cmStrCat<>((string *)local_88,&local_b8,&local_108);
  std::__cxx11::string::~string((string *)(ninjaOutputDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_d8);
  psVar3 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,(string *)local_88);
  std::__cxx11::string::string
            ((string *)(fatbinary.RspFile.field_2._M_local_buf + 8),(string *)psVar3);
  LanguageLinkerCudaFatbinaryRule((string *)&__range1,this,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_268,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(architectures);
  architectureKind =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(architectures);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&architectureKind), bVar1) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::find((char)pbVar4,0x2d);
    std::__cxx11::string::substr((ulong)((long)&cubin.field_2 + 8),(ulong)pbVar4);
    cmAlphaNum::cmAlphaNum(&local_318,(string *)((long)&fatbinary.RspFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&dlink.RspFile.field_2 + 8),"/sm_");
    cmStrCat<std::__cxx11::string,char[7]>
              ((string *)local_2e8,&local_318,(cmAlphaNum *)((long)&dlink.RspFile.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&cubin.field_2 + 8),(char (*) [7])".cubin");
    LanguageLinkerCudaDeviceRule(&local_488,this,config);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_468,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dlink.WorkDirOuts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
    local_4c0 = &local_4b8;
    std::__cxx11::string::string((string *)local_4c0,(string *)local_2e8);
    local_498 = &local_4b8;
    local_490 = 1;
    __l_02._M_len = 1;
    __l_02._M_array = local_498;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&dlink.Rule.field_2 + 8),__l_02);
    local_c58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_498;
    do {
      local_c58 = local_c58 + -1;
      std::__cxx11::string::~string((string *)local_c58);
    } while (local_c58 != &local_4b8);
    cmAlphaNum::cmAlphaNum(&local_510,"sm_");
    cmAlphaNum::cmAlphaNum(&local_540,(string *)((long)&cubin.field_2 + 8));
    cmStrCat<>(&local_4e0,&local_510,&local_540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"ARCH",&local_561);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&dlink.OrderOnlyDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_560);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator(&local_561);
    std::__cxx11::string::~string((string *)&local_4e0);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fatbinary.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_5b8,"--register-link-binaries=");
      cmAlphaNum::cmAlphaNum(&local_5e8,(string *)((long)&fatbinary.RspFile.field_2 + 8));
      cmStrCat<char[23]>(&local_588,&local_5b8,&local_5e8,(char (*) [23])"/cmake_cuda_register.h");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"REGISTER",&local_609)
      ;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&dlink.OrderOnlyDeps.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_608);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_588);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator(&local_609);
      std::__cxx11::string::~string((string *)&local_588);
    }
    cmAlphaNum::cmAlphaNum(&local_660," -im=profile=sm_");
    cmAlphaNum::cmAlphaNum(&local_690,(string *)((long)&cubin.field_2 + 8));
    cmStrCat<char[7],std::__cxx11::string>
              (&local_630,&local_660,&local_690,(char (*) [7])",file=",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"PROFILES",&local_6b1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fatbinary.OrderOnlyDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6b0);
    std::__cxx11::string::operator+=((string *)pmVar7,(string *)&local_630);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator(&local_6b1);
    std::__cxx11::string::~string((string *)&local_630);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &fatbinary.WorkDirOuts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (this_01,(ostream *)pcVar5,(cmNinjaBuild *)local_468,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_468);
    std::__cxx11::string::~string((string *)local_2e8);
    std::__cxx11::string::~string((string *)(cubin.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_6f0 = &local_6e8;
  cmAlphaNum::cmAlphaNum(&local_720,(string *)((long)&fatbinary.RspFile.field_2 + 8));
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&localGen,"/cmake_cuda_fatbin.h");
  cmStrCat<>(&local_6e8,&local_720,(cmAlphaNum *)&localGen);
  local_6c8 = &local_6e8;
  local_6c0 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_6c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&fatbinary.Rule.field_2 + 8),__l_01);
  local_cf0 = (string *)&local_6c8;
  do {
    local_cf0 = local_cf0 + -1;
    std::__cxx11::string::~string((string *)local_cf0);
  } while (local_cf0 != &local_6e8);
  pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (this_01,(ostream *)pcVar5,(cmNinjaBuild *)local_268,0,(bool *)0x0);
  dcompile.RspFile.field_2._8_8_ =
       cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  LanguageLinkerCudaDeviceCompileRule(&local_898,this,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_878,&local_898);
  std::__cxx11::string::~string((string *)&local_898);
  local_8d0 = (undefined1  [8])(local_8d0 + 8);
  std::__cxx11::string::string
            ((string *)local_8d0,
             (string *)
             explicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_8a8 = (iterator)(local_8d0 + 8);
  local_8a0 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_8a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&dcompile.Rule.field_2 + 8),__l_00);
  local_d20 = (string *)&local_8a8;
  do {
    local_d20 = local_d20 + -0x20;
    std::__cxx11::string::~string(local_d20);
  } while (local_d20 != (string *)(local_8d0 + 8));
  local_908 = &local_900;
  cmAlphaNum::cmAlphaNum(&local_938,(string *)((long)&fatbinary.RspFile.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_968,"/cmake_cuda_fatbin.h");
  cmStrCat<>(&local_900,&local_938,&local_968);
  local_8e0 = &local_900;
  local_8d8 = 1;
  __l._M_len = 1;
  __l._M_array = local_8e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dcompile.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__l);
  local_d38 = (string *)&local_8e0;
  do {
    local_d38 = local_d38 + -1;
    std::__cxx11::string::~string((string *)local_d38);
  } while (local_d38 != &local_900);
  pcVar6 = (cmOutputConverter *)(dcompile.RspFile.field_2._8_8_ + 8);
  cmAlphaNum::cmAlphaNum(&local_9e8,(string *)local_88);
  cmAlphaNum::cmAlphaNum(&local_a18,"/cmake_cuda_fatbin.h");
  cmStrCat<>(&local_9b8,&local_9e8,&local_a18);
  local_998 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_9b8);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_988,pcVar6,local_998,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"FATBIN",&local_a39);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&dcompile.OrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a38);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_988);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9b8);
  pcVar6 = (cmOutputConverter *)(dcompile.RspFile.field_2._8_8_ + 8);
  cmAlphaNum::cmAlphaNum(&local_ac0,(string *)local_88);
  cmAlphaNum::cmAlphaNum(&local_af0,"/cmake_cuda_register.h");
  cmStrCat<>(&local_a90,&local_ac0,&local_af0);
  local_a70 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a90);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_a60,pcVar6,local_a70,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,"REGISTER",(allocator<char> *)((long)&linkLineComputer.GG + 7));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&dcompile.OrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b10);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLineComputer.GG + 7));
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a90);
  local_d98 = (cmOutputConverter *)0x0;
  if (dcompile.RspFile.field_2._8_8_ != 0) {
    local_d98 = (cmOutputConverter *)(dcompile.RspFile.field_2._8_8_ + 8);
  }
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)((long)&frameworkPath.field_2 + 8),
             (cmLocalGenerator *)dcompile.RspFile.field_2._8_8_);
  cmStateSnapshot::GetDirectory(&local_b88,(cmStateSnapshot *)((long)&frameworkPath.field_2 + 8));
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_b60,local_d98,&local_b88,this_01);
  iVar2 = (*(this_01->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)local_b60,(bool)((byte)iVar2 & 1));
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_c00);
  this_00 = dcompile.RspFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"LINK_FLAGS",&local_c21);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&dcompile.OrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c20);
  target = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)this_00,(cmLinkLineDeviceComputer *)local_b60,config,
             (string *)local_c00,pmVar7,(string *)((long)&linkPath.field_2 + 8),
             (string *)((long)&linkLibs.field_2 + 8),target);
  std::__cxx11::string::~string((string *)&local_c20);
  std::allocator<char>::~allocator(&local_c21);
  pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (this_01,(ostream *)pcVar5,(cmNinjaBuild *)local_878,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)local_c00);
  std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  cmNinjaLinkLineDeviceComputer::~cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_b60);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_878);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_268);
  std::__cxx11::string::~string((string *)(fatbinary.RspFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements(
  const std::string& config, const std::vector<std::string>& architectures,
  const std::string& output)
{
  // Ensure there are no duplicates.
  const cmNinjaDeps explicitDeps = [&]() -> std::vector<std::string> {
    std::unordered_set<std::string> depsSet;
    const cmNinjaDeps linkDeps =
      this->ComputeLinkDeps(this->TargetLinkLanguage(config), config, true);
    const cmNinjaDeps objects = this->GetObjects(config);
    depsSet.insert(linkDeps.begin(), linkDeps.end());
    depsSet.insert(objects.begin(), objects.end());

    std::vector<std::string> deps;
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  cmGlobalNinjaGenerator* globalGen{ this->GetGlobalGenerator() };
  const std::string objectDir =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));
  const std::string ninjaOutputDir = this->ConvertToNinjaPath(objectDir);

  cmNinjaBuild fatbinary(this->LanguageLinkerCudaFatbinaryRule(config));

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(ninjaOutputDir, "/sm_", architecture, ".cubin");

    cmNinjaBuild dlink(this->LanguageLinkerCudaDeviceRule(config));
    dlink.ExplicitDeps = explicitDeps;
    dlink.Outputs = { cubin };
    dlink.Variables["ARCH"] = cmStrCat("sm_", architecture);

    // The generated register file contains macros that when expanded register
    // the device routines. Because the routines are the same for all
    // architectures the register file will be the same too. Thus generate it
    // only on the first invocation to reduce overhead.
    if (fatbinary.ExplicitDeps.empty()) {
      dlink.Variables["REGISTER"] = cmStrCat(
        "--register-link-binaries=", ninjaOutputDir, "/cmake_cuda_register.h");
    }

    fatbinary.Variables["PROFILES"] +=
      cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinary.ExplicitDeps.emplace_back(cubin);

    globalGen->WriteBuild(this->GetCommonFileStream(), dlink);
  }

  // Combine all architectures into a single fatbinary.
  fatbinary.Outputs = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  globalGen->WriteBuild(this->GetCommonFileStream(), fatbinary);

  // Compile the stub that registers the kernels and contains the fatbinaries.
  cmLocalNinjaGenerator* localGen{ this->GetLocalGenerator() };
  cmNinjaBuild dcompile(this->LanguageLinkerCudaDeviceCompileRule(config));
  dcompile.Outputs = { output };
  dcompile.ExplicitDeps = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  dcompile.Variables["FATBIN"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_fatbin.h"), cmOutputConverter::SHELL);
  dcompile.Variables["REGISTER"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_register.h"), cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    localGen, localGen->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  // Link libraries and paths are only used during the final executable/library
  // link.
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  localGen->GetDeviceLinkFlags(linkLineComputer, config, linkLibs,
                               dcompile.Variables["LINK_FLAGS"], frameworkPath,
                               linkPath, this->GetGeneratorTarget());

  globalGen->WriteBuild(this->GetCommonFileStream(), dcompile);
}